

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.cpp
# Opt level: O2

void __thiscall ThreadPoolTest_push_Test::TestBody(ThreadPoolTest_push_Test *this)

{
  char *pcVar1;
  long lVar2;
  bool bVar3;
  AssertHelper aAStack_1a8 [8];
  long *local_1a0;
  AssertionResult gtest_ar;
  atomic<unsigned_long> iterations;
  _Any_data local_180;
  code *local_170;
  code *local_168;
  thread_pool pool;
  
  iterations.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
  jessilib::thread_pool::thread_pool(&pool);
  lVar2 = 100;
  while (bVar3 = lVar2 != 0, lVar2 = lVar2 + -1, bVar3) {
    local_180._8_8_ = 0;
    local_168 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/thread_pool.cpp:60:13)>
                ::_M_invoke;
    local_170 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/thread_pool.cpp:60:13)>
                ::_M_manager;
    local_180._M_unused._M_object = &iterations;
    jessilib::thread_pool::push(&pool,&local_180);
    std::_Function_base::~_Function_base((_Function_base *)&local_180);
  }
  jessilib::thread_pool::join();
  testing::internal::CmpHelperEQ<std::atomic<unsigned_long>,unsigned_long>
            ((internal *)&gtest_ar,"iterations","total_iterations",&iterations,&total_iterations);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_1a0);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (aAStack_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/thread_pool.cpp"
               ,0x42,pcVar1);
    testing::internal::AssertHelper::operator=(aAStack_1a8,(Message *)&local_1a0);
    testing::internal::AssertHelper::~AssertHelper(aAStack_1a8);
    if (local_1a0 != (long *)0x0) {
      (**(code **)(*local_1a0 + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  jessilib::thread_pool::~thread_pool(&pool);
  return;
}

Assistant:

TEST(ThreadPoolTest, push) {
	std::atomic<size_t> iterations{0};
	thread_pool pool;

	repeat (total_iterations) {
		pool.push([&iterations]() {
			++iterations;
		});
	}

	pool.join();
	EXPECT_EQ(iterations, total_iterations);
}